

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::PushPopFrameHelper::PushPopFrameHelper
          (PushPopFrameHelper *this,InterpreterStackFrame *interpreterFrame,void *returnAddress,
          void *addressOfReturnAddress)

{
  ThreadContext *this_00;
  
  this_00 = *(ThreadContext **)(*(long *)(interpreterFrame + 0x78) + 0x3b8);
  this->m_threadContext = this_00;
  this->m_interpreterFrame = interpreterFrame;
  this->m_isHiddenFrame = false;
  *(void **)(interpreterFrame + 0x98) = returnAddress;
  *(void **)(interpreterFrame + 0xa0) = addressOfReturnAddress;
  if ((*(byte *)(*(long *)(interpreterFrame + 0x88) + 0x46) & 2) == 0) {
    ThreadContext::PushInterpreterFrame(this_00,interpreterFrame);
    return;
  }
  this->m_isHiddenFrame = true;
  return;
}

Assistant:

PushPopFrameHelper(InterpreterStackFrame *interpreterFrame, void *returnAddress, void *addressOfReturnAddress)
                : m_threadContext(interpreterFrame->GetScriptContext()->GetThreadContext()), m_interpreterFrame(interpreterFrame), m_isHiddenFrame(false)
            {
                interpreterFrame->returnAddress = returnAddress; // Ensure these are set before pushing to interpreter frame list
                interpreterFrame->addressOfReturnAddress = addressOfReturnAddress;
                if (interpreterFrame->GetFunctionBody()->GetIsAsmjsMode())
                {
                    m_isHiddenFrame = true;
                }
                else
                {
                    m_threadContext->PushInterpreterFrame(interpreterFrame);
                }
            }